

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

int sha3_done(hash_state *md,uchar *hash)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  
  if (md == (hash_state *)0x0) {
    sha3_done_cold_1();
  }
  if (hash == (uchar *)0x0) {
    sha3_done_cold_2();
  }
  *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) =
       *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) ^ (md->chc).length ^
       6L << ((ulong)(byte)(md->dummy[0x198] << 3) & 0x3f);
  puVar1 = (ulong *)((long)md + (0x18 - (ulong)(md->sha3).capacity_words) * 8 + 8);
  *puVar1 = *puVar1 ^ 0x8000000000000000;
  keccakf((md->whirlpool).state);
  auVar4 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar5 = vpbroadcastq_avx512f(ZEXT816(0x19));
  lVar3 = 0;
  do {
    auVar6 = vpbroadcastq_avx512f();
    auVar6 = vporq_avx512f(auVar6,auVar4);
    uVar2 = vpcmpuq_avx512f(auVar6,auVar5,1);
    auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)md + lVar3 * 8 + 8));
    auVar7._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar6._8_8_;
    auVar7._0_8_ = (ulong)((byte)uVar2 & 1) * auVar6._0_8_;
    auVar7._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar6._16_8_;
    auVar7._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar6._24_8_;
    auVar7._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar6._32_8_;
    auVar7._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar6._40_8_;
    auVar7._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar6._48_8_;
    auVar7._56_8_ = (uVar2 >> 7) * auVar6._56_8_;
    auVar6 = vmovdqu64_avx512f(auVar7);
    *(undefined1 (*) [64])((md->chc).buf + 0x48 + lVar3 * 8) = auVar6;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  memcpy(hash,(md->chc).buf + 0x48,(ulong)(md->sha3).capacity_words << 2);
  return 0;
}

Assistant:

int sha3_done(hash_state *md, unsigned char *hash)
{
   unsigned i;

   LTC_ARGCHK(md   != NULL);
   LTC_ARGCHK(hash != NULL);

   md->sha3.s[md->sha3.word_index] ^= (md->sha3.saved ^ (CONST64(0x06) << (md->sha3.byte_index * 8)));
   md->sha3.s[SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words - 1] ^= CONST64(0x8000000000000000);
   keccakf(md->sha3.s);

   /* store sha3.s[] as little-endian bytes into sha3.sb */
   for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
      STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
   }

   XMEMCPY(hash, md->sha3.sb, md->sha3.capacity_words * 4);
   return CRYPT_OK;
}